

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall
KDIS::NETWORK::Connection::RemoveSubscriber(Connection *this,ConnectionSubscriber *S)

{
  const_iterator __position;
  
  if (S == (ConnectionSubscriber *)0x0) {
    return;
  }
  __position._M_current =
       (this->m_vpSubscribers).
       super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    while( true ) {
      if (__position._M_current ==
          (this->m_vpSubscribers).
          super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      if (*__position._M_current == S) break;
      __position._M_current = __position._M_current + 1;
    }
    __position._M_current =
         (ConnectionSubscriber **)
         std::
         vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
         ::erase(&this->m_vpSubscribers,__position);
  } while( true );
}

Assistant:

void Connection::RemoveSubscriber( ConnectionSubscriber * S )
{
    if( S )
    {
        // Perform a linear search for the subscriber.
        vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
        vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
        while( itr != itrEnd )
        {
            if( *itr == S )
            {
                // Remove the subsriber
                itr = m_vpSubscribers.erase( itr );
                itrEnd = m_vpSubscribers.end();

                // Now continue searching, the subscriber may have been added twice...
            }
            else
            {
                ++itr;
            }
        }
    }
}